

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O3

bool RunTests(void)

{
  char cVar1;
  code *pcVar2;
  size_t sVar3;
  ulong uVar4;
  code **ppcVar5;
  code *local_b8;
  char *local_b0;
  code *local_a8;
  char *local_a0;
  code *local_98;
  char *local_90;
  code *local_88;
  char *local_80;
  code *local_78;
  char *local_70;
  code *local_68;
  char *local_60;
  code *local_58;
  char *local_50;
  code *local_48;
  char *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  ppcVar5 = &local_b8;
  pcVar2 = TestAssignment;
  local_b8 = TestAssignment;
  local_b0 = "TestAssignment";
  local_a8 = TestConstants;
  local_a0 = "TestConstants";
  local_98 = TestIncrement;
  local_90 = "TestIncrement";
  local_88 = TestComparisons;
  local_80 = "TestComparisons";
  local_78 = TestGetTickCount;
  local_70 = "TestGetTickCount";
  local_68 = TestCompression;
  local_60 = "TestCompression";
  local_58 = TestCompressionNoBias8;
  local_50 = "TestCompressionNoBias8";
  local_48 = TestCompressionNoBias16;
  local_40 = "TestCompressionNoBias16";
  local_38 = 0;
  uStack_30 = 0;
  uVar4 = 1;
  do {
    cVar1 = (*pcVar2)();
    if (cVar1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test failed: ",0xd);
      pcVar2 = ppcVar5[1];
      if (pcVar2 == (code *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106040);
      }
      else {
        sVar3 = strlen((char *)pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)pcVar2,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
      return (bool)cVar1;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test passed: ",0xd);
    pcVar2 = ppcVar5[1];
    if (pcVar2 == (code *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106040);
    }
    else {
      sVar3 = strlen((char *)pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)pcVar2,sVar3)
      ;
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    ppcVar5 = &local_b8 + uVar4 * 2;
    pcVar2 = *ppcVar5;
    uVar4 = (ulong)((int)uVar4 + 1);
  } while (pcVar2 != (code *)0x0);
  return (bool)cVar1;
}

Assistant:

TestDescriptor(TestF fn = nullptr, const char* name = nullptr)
        : Function(fn)
        , Name(name)
    {
    }